

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DatabaseBackedPoolTest_FindFileContainingSymbol_Test::
~DatabaseBackedPoolTest_FindFileContainingSymbol_Test
          (DatabaseBackedPoolTest_FindFileContainingSymbol_Test *this)

{
  (this->super_DatabaseBackedPoolTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DatabaseBackedPoolTest_0188a878;
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_DatabaseBackedPoolTest).database_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

TEST_F(DatabaseBackedPoolTest, FindFileContainingSymbol) {
  DescriptorPool pool(&database_);

  const FileDescriptor* file = pool.FindFileContainingSymbol("Foo");
  ASSERT_TRUE(file != nullptr);
  EXPECT_EQ("foo.proto", file->name());
  EXPECT_EQ(file, pool.FindFileByName("foo.proto"));

  EXPECT_TRUE(pool.FindFileContainingSymbol("NoSuchSymbol") == nullptr);
}